

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_tests.cpp
# Opt level: O2

void __thiscall
compress_tests::compress_p2pk_scripts_not_on_curve::test_method
          (compress_p2pk_scripts_not_on_curve *this)

{
  bool bVar1;
  CScript *this_00;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  long lVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  CompressedScript *pCVar4;
  bool *pbVar5;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vch;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  undefined1 local_211;
  char *local_210;
  char *local_208;
  undefined **local_200;
  undefined1 local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  bool success;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  bool done;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_raw;
  CScript uncompressed_script;
  uint local_118 [2];
  CompressedScript compressed_script;
  CompressedScript out;
  CScript script;
  CPubKey pubkey_not_on_curve;
  XOnlyPubKey x_not_on_curve;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  do {
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&out,
               &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng.
                super_RandomMixin<FastRandomContext>,0x20);
    vch.m_size = out._union._8_8_ - out._union._0_8_;
    vch.m_data = (uchar *)out._union.indirect_contents.indirect;
    base_blob<256U>::base_blob((base_blob<256U> *)&pubkey_not_on_curve,vch);
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = pubkey_not_on_curve.vch[1];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = pubkey_not_on_curve.vch[2];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = pubkey_not_on_curve.vch[3];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = pubkey_not_on_curve.vch[4];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = pubkey_not_on_curve.vch[5];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = pubkey_not_on_curve.vch[6];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = pubkey_not_on_curve.vch[7];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = pubkey_not_on_curve.vch[0];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] =
         pubkey_not_on_curve.vch[0x10];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] =
         pubkey_not_on_curve.vch[0x11];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] =
         pubkey_not_on_curve.vch[0x12];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] =
         pubkey_not_on_curve.vch[0x13];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] =
         pubkey_not_on_curve.vch[0x14];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] =
         pubkey_not_on_curve.vch[0x15];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] =
         pubkey_not_on_curve.vch[0x16];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] =
         pubkey_not_on_curve.vch[0x17];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] =
         pubkey_not_on_curve.vch[0x18];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] =
         pubkey_not_on_curve.vch[0x19];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] =
         pubkey_not_on_curve.vch[0x1a];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] =
         pubkey_not_on_curve.vch[0x1b];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] =
         pubkey_not_on_curve.vch[0x1c];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] =
         pubkey_not_on_curve.vch[0x1d];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] =
         pubkey_not_on_curve.vch[0x1e];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] =
         pubkey_not_on_curve.vch[0x1f];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = pubkey_not_on_curve.vch[8];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = pubkey_not_on_curve.vch[9];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = pubkey_not_on_curve.vch[10]
    ;
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] =
         pubkey_not_on_curve.vch[0xb];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] =
         pubkey_not_on_curve.vch[0xc];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] =
         pubkey_not_on_curve.vch[0xd];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] =
         pubkey_not_on_curve.vch[0xe];
    x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] =
         pubkey_not_on_curve.vch[0xf];
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&out);
    bVar1 = XOnlyPubKey::IsFullyValid(&x_not_on_curve);
  } while (bVar1);
  pubkey_not_on_curve.vch[0] = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&pubkey_raw,0x41,pubkey_not_on_curve.vch,(allocator_type *)&out);
  *pubkey_raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = '\x04';
  *(undefined8 *)
   (pubkey_raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + 0x11) =
       x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems._16_8_;
  *(undefined8 *)
   (pubkey_raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + 0x19) =
       x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems._24_8_;
  *(undefined8 *)
   (pubkey_raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + 1) =
       x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_;
  *(undefined8 *)
   (pubkey_raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + 9) =
       x_not_on_curve.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_;
  CPubKey::Set<unsigned_char_const*>
            (&pubkey_not_on_curve,
             pubkey_raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             pubkey_raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  if (((pubkey_not_on_curve.vch[0] & 0xfe) != 2) &&
     ((7 < pubkey_not_on_curve.vch[0] || ((0xd0U >> (pubkey_not_on_curve.vch[0] & 0x1f) & 1) == 0)))
     ) {
    __assert_fail("pubkey_not_on_curve.IsValid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
                  ,0x94,"void compress_tests::compress_p2pk_scripts_not_on_curve::test_method()");
  }
  bVar1 = CPubKey::IsFullyValid(&pubkey_not_on_curve);
  if (bVar1) {
    __assert_fail("!pubkey_not_on_curve.IsFullyValid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
                  ,0x95,"void compress_tests::compress_p2pk_scripts_not_on_curve::test_method()");
  }
  out._union._16_8_ = 0;
  out._union._24_8_ = 0;
  out._union.indirect_contents.indirect = (char *)0x0;
  out._union._8_8_ = 0;
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&compressed_script,
             &pubkey_not_on_curve);
  this_00 = CScript::operator<<((CScript *)&out,
                                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                &compressed_script);
  other = &CScript::operator<<(this_00,OP_CHECKSIG)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector(&script.super_CScriptBase,other);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&compressed_script);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&out);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x97;
  file.m_begin = (iterator)&local_160;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_170,msg);
  out._union._8_8_ = out._union._8_8_ & 0xffffffffffffff00;
  out._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011480b0;
  out._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  out._union._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_178 = "";
  compressed_script._union._0_4_ = script.super_CScriptBase._size - 0x1d;
  if (script.super_CScriptBase._size < 0x1d) {
    compressed_script._union._0_4_ = script.super_CScriptBase._size;
  }
  pCVar4 = &compressed_script;
  uncompressed_script.super_CScriptBase._union._0_4_ = 0x43;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&out,&local_180,0x97,1,2,pCVar4,"script.size()",&uncompressed_script,"67U");
  out._union._16_8_ = 0;
  out._union._24_8_ = 0;
  out._union.indirect_contents.indirect = (char *)0x0;
  out._union._8_8_ = 0;
  out._union.direct[0x20] = '\0';
  out._size = 0;
  done = CompressScript(&script,&out);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x9b;
  file_00.m_begin = (iterator)&local_198;
  msg_00.m_end = (iterator)pCVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1a8,
             msg_00);
  compressed_script._union.direct[8] = '\0';
  compressed_script._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011480b0;
  compressed_script._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  compressed_script._union._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_1b0 = "";
  uncompressed_script.super_CScriptBase._union.indirect_contents.indirect =
       (char *)((ulong)uncompressed_script.super_CScriptBase._union.indirect_contents.indirect &
               0xffffffffffffff00);
  pvVar3 = (iterator)0x2;
  pbVar5 = &done;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&compressed_script,&local_1b8,0x9b,1,2,pbVar5,"done",&uncompressed_script,"false");
  prevector<33U,_unsigned_char,_unsigned_int,_int>::prevector<unsigned_char_*>
            (&compressed_script,(uchar *)&x_not_on_curve,(uchar *)&local_38);
  local_118[0] = 4;
  local_118[1] = 5;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 4) {
    uncompressed_script.super_CScriptBase._union._16_8_ = 0;
    uncompressed_script.super_CScriptBase._24_8_ = 0;
    uncompressed_script.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
    uncompressed_script.super_CScriptBase._union._8_8_ = 0;
    success = DecompressScript((CScript *)&uncompressed_script.super_CScriptBase,
                               *(uint *)((long)local_118 + lVar2),&compressed_script);
    local_1d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
    ;
    local_1c8 = "";
    local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0xa3;
    file_01.m_begin = (iterator)&local_1d0;
    msg_01.m_end = pbVar5;
    msg_01.m_begin = pvVar3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1e0,
               msg_01);
    local_1f8 = 0;
    local_200 = &PTR__lazy_ostream_011480b0;
    local_1f0 = boost::unit_test::lazy_ostream::inst;
    local_1e8 = "";
    local_210 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
    ;
    local_208 = "";
    local_211 = 0;
    pvVar3 = (iterator)0x2;
    pbVar5 = &success;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (&local_200,&local_210,0xa3,1,2,&success,"success",&local_211,"false");
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              (&uncompressed_script.super_CScriptBase);
  }
  prevector<33U,_unsigned_char,_unsigned_int,_int>::~prevector(&compressed_script);
  prevector<33U,_unsigned_char,_unsigned_int,_int>::~prevector(&out);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&script.super_CScriptBase);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&pubkey_raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(compress_p2pk_scripts_not_on_curve)
{
    XOnlyPubKey x_not_on_curve;
    do {
        x_not_on_curve = XOnlyPubKey(m_rng.randbytes(32));
    } while (x_not_on_curve.IsFullyValid());

    // Check that P2PK script with uncompressed pubkey [=> OP_PUSH65 <0x04 .....> OP_CHECKSIG]
    // which is not fully valid (i.e. point is not on curve) can't be compressed
    std::vector<unsigned char> pubkey_raw(65, 0);
    pubkey_raw[0] = 4;
    std::copy(x_not_on_curve.begin(), x_not_on_curve.end(), &pubkey_raw[1]);
    CPubKey pubkey_not_on_curve(pubkey_raw);
    assert(pubkey_not_on_curve.IsValid());
    assert(!pubkey_not_on_curve.IsFullyValid());
    CScript script = CScript() << ToByteVector(pubkey_not_on_curve) << OP_CHECKSIG;
    BOOST_CHECK_EQUAL(script.size(), 67U);

    CompressedScript out;
    bool done = CompressScript(script, out);
    BOOST_CHECK_EQUAL(done, false);

    // Check that compressed P2PK script with uncompressed pubkey that is not fully
    // valid (i.e. x coordinate of the pubkey is not on curve) can't be decompressed
    CompressedScript compressed_script(x_not_on_curve.begin(), x_not_on_curve.end());
    for (unsigned int compression_id : {4, 5}) {
        CScript uncompressed_script;
        bool success = DecompressScript(uncompressed_script, compression_id, compressed_script);
        BOOST_CHECK_EQUAL(success, false);
    }
}